

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::anon_unknown_173::print_rel_only
                   (string *__return_storage_ptr__,Relationship *rel,string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t indent_00;
  uint32_t n;
  long lVar6;
  char *pcVar7;
  stringstream ss;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  uVar4 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"rel ",4);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
  uVar5 = 0x3ac570;
  indent_00 = 0x3ac570;
  switch(rel->type) {
  case DefineOnly:
    break;
  case Path:
    indent_00 = uVar5;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0," = ",3);
    ::std::operator<<(local_1a0,&rel->targetPath);
    break;
  case PathVector:
    indent_00 = uVar5;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0," = ",3);
    ::std::operator<<(local_1a0,
                      (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                      &rel->targetPathVector);
    break;
  case ValueBlock:
    pcVar7 = " = None";
    lVar6 = 7;
    indent_00 = uVar5;
    goto LAB_002b83a4;
  default:
    pcVar7 = "[InternalErrror]";
    lVar6 = 0x10;
    indent_00 = uVar4;
LAB_002b83a4:
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,pcVar7,lVar6);
  }
  bVar1 = AttrMetas::authored(&rel->_metas);
  if (bVar1) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0," (\n",3);
    print_attr_metas_abi_cxx11_
              (&local_1d0,(tinyusdz *)&rel->_metas,(AttrMeta *)(ulong)(indent + 1),indent_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    pprint::Indent_abi_cxx11_(&local_1f0,(pprint *)(ulong)indent,n);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  psVar3 = (string *)::std::ios_base::~ios_base(local_130);
  return psVar3;
}

Assistant:

std::string print_rel_only(const Relationship &rel, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  ss << "rel " << name;

  if (!rel.has_value()) {
    // nothing todo
  } else if (rel.is_path()) {
    ss << " = " << rel.targetPath;
  } else if (rel.is_pathvector()) {
    ss << " = " << rel.targetPathVector;
  } else if (rel.is_blocked()) {
    ss << " = None";
  } else {
    ss << "[InternalErrror]";
  }

  if (rel.metas().authored()) {
    ss << " (\n"
       << print_attr_metas(rel.metas(), indent + 1) << pprint::Indent(indent)
       << ")";
  }

  ss << "\n";

  return ss.str();
}